

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_sock.c
# Opt level: O0

BIO * BIO_new_socket(int sock,int close_flag)

{
  BIO_METHOD *type;
  BIO *ret;
  undefined8 local_8;
  
  type = BIO_s_socket();
  local_8 = BIO_new(type);
  if (local_8 == (BIO *)0x0) {
    local_8 = (BIO *)0x0;
  }
  else {
    BIO_int_ctrl(local_8,0x68,(long)close_flag,sock);
  }
  return local_8;
}

Assistant:

BIO *BIO_new_socket(int fd, int close_flag)
{
    BIO *ret;

    ret = BIO_new(BIO_s_socket());
    if (ret == NULL)
        return NULL;
    BIO_set_fd(ret, fd, close_flag);
# ifndef OPENSSL_NO_KTLS
    {
        /*
         * The new socket is created successfully regardless of ktls_enable.
         * ktls_enable doesn't change any functionality of the socket, except
         * changing the setsockopt to enable the processing of ktls_start.
         * Thus, it is not a problem to call it for non-TLS sockets.
         */
        ktls_enable(fd);
    }
# endif
    return ret;
}